

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O1

void * fs_create_savepoint(char *name,int name_length)

{
  _Rb_tree_header *p_Var1;
  Savepoint *this;
  string local_48;
  
  this = (Savepoint *)operator_new(0x50);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->metainfo_).data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,name,name + name_length);
  ser::Savepoint::Init(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return this;
}

Assistant:

void* fs_create_savepoint(const char* name, int name_length)
{
    Savepoint* pSavepoint = new Savepoint;
    pSavepoint->Init(std::string(name, name_length));
    return reinterpret_cast<void*>(pSavepoint);
}